

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

void NscPushElementAccess(CNscPStackEntry *pOut,CNscPStackEntry *pStruct,NscType nType,int nElement)

{
  bool bVar1;
  NscType NVar2;
  NscSymbol *pSymbol_00;
  uchar *puVar3;
  undefined4 in_ECX;
  int in_EDX;
  CNscPStackEntry *in_RSI;
  NscSymbol *pSymbol;
  NscPCodeVariable *pv;
  undefined4 uVar4;
  NscType in_stack_ffffffffffffffac;
  CNscContext *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  NscType in_stack_ffffffffffffffc8;
  NscType in_stack_ffffffffffffffcc;
  CNscPStackEntry *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  CNscPStackEntry *in_stack_ffffffffffffffe0;
  int nElement_00;
  
  bVar1 = CNscPStackEntry::IsSimpleVariable((CNscPStackEntry *)0x1fc4f0);
  if (bVar1) {
    puVar3 = CNscPStackEntry::GetData(in_RSI);
    uVar4 = *(undefined4 *)(puVar3 + 0x28);
    CNscPStackEntry::PushVariable
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8,
               (UINT32)puVar3);
    pSymbol_00 = CNscContext::GetSymbol
                           (in_stack_ffffffffffffffb0,CONCAT44(in_stack_ffffffffffffffac,uVar4));
    if (pSymbol_00 == (NscSymbol *)0x0) {
      __assert_fail("pSymbol",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x16d,
                    "void NscPushElementAccess(CNscPStackEntry *, CNscPStackEntry *, NscType, int)")
      ;
    }
    NscParserReferenceSymbol(pSymbol_00);
  }
  else {
    iVar5 = in_EDX;
    NVar2 = CNscPStackEntry::GetType(in_RSI);
    puVar3 = CNscPStackEntry::GetData(in_RSI);
    nElement_00 = (int)((ulong)puVar3 >> 0x20);
    CNscPStackEntry::GetDataSize(in_RSI);
    CNscPStackEntry::PushElement
              (in_stack_ffffffffffffffe0,(NscType)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (NscType)in_stack_ffffffffffffffd8,nElement_00,(uchar *)CONCAT44(in_ECX,NVar2),
               CONCAT44(iVar5,in_stack_ffffffffffffffc0));
  }
  CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (0x1f < in_EDX) {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedStructAccess);
  }
  return;
}

Assistant:

void NscPushElementAccess (CNscPStackEntry *pOut, 
	CNscPStackEntry *pStruct, NscType nType, int nElement)
{

	//
	// If this is a simple variable
	//

	if (pStruct ->IsSimpleVariable ())
	{
		NscPCodeVariable *pv = (NscPCodeVariable *) pStruct ->GetData ();
		pOut ->PushVariable (nType, pv ->nType, pv ->nSymbol, nElement, 
			pv ->nStackOffset, pv ->ulFlags);

		NscSymbol *pSymbol = g_pCtx ->GetSymbol (pv ->nSymbol);
		assert (pSymbol);

		NscParserReferenceSymbol (pSymbol);
	}

	//
	// Otherwise, we need to do an element access
	//

	else
	{
		pOut ->PushElement (nType, pStruct ->GetType (), nElement,
			pStruct ->GetData (), pStruct ->GetDataSize ());
	}

	//
	// Set the return type
	//

	pOut ->SetType (nType);

	//
	// If we are accessing an element that is also a structure, emit a warning
	// as this does not work correctly with the standard compiler
	//

	if (nType >= NscType_Struct_0)
	{
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedStructAccess);
	}
}